

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix<double> * __thiscall
Matrix<double>::compile
          (Matrix<double> *__return_storage_ptr__,Matrix<double> *this,uint beg_col,uint end_col)

{
  undefined8 uVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  uint j;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  Matrix(__return_storage_ptr__,(this->m_shape).n_row,end_col - beg_col);
  for (uVar5 = 0; uVar5 < (__return_storage_ptr__->m_shape).n_row; uVar5 = uVar5 + 1) {
    lVar4 = 0;
    for (uVar3 = (ulong)beg_col; uVar3 < end_col; uVar3 = uVar3 + 1) {
      uVar1 = *(undefined8 *)
               (*(long *)&(this->m_elems).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + uVar3 * 8);
      pvVar2 = operator[](__return_storage_ptr__,(uint)uVar5);
      *(undefined8 *)
       ((long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start + lVar4) = uVar1;
      lVar4 = lVar4 + 8;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> Matrix<T>::compile(unsigned beg_col, unsigned end_col) const{
    Matrix<T> matrix(m_shape.n_row, end_col-beg_col);

    for(unsigned i=0;i<matrix.m_shape.n_row;++i){
        for(unsigned j=beg_col;j<end_col;++j){
            matrix[i][j-beg_col]=m_elems[i][j];
        }
    }

    return matrix;
}